

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackageSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
          (BumpAllocator *this,Compilation *args,char (*args_1) [4],SourceLocation *args_2,
          NetType *args_3,VariableLifetime *args_4)

{
  char (*compilation) [4];
  PackageSymbol *this_00;
  string_view local_48;
  VariableLifetime *local_38;
  VariableLifetime *args_local_4;
  NetType *args_local_3;
  SourceLocation *args_local_2;
  char (*args_local_1) [4];
  Compilation *args_local;
  BumpAllocator *this_local;
  
  local_38 = args_4;
  args_local_4 = (VariableLifetime *)args_3;
  args_local_3 = (NetType *)args_2;
  args_local_2 = (SourceLocation *)args_1;
  args_local_1 = (char (*) [4])args;
  args_local = (Compilation *)this;
  this_00 = (PackageSymbol *)allocate(this,0x98,8);
  compilation = args_local_1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,(char *)args_local_2);
  ast::PackageSymbol::PackageSymbol
            (this_00,(Compilation *)compilation,local_48,
             *(SourceLocation *)&args_local_3->super_Symbol,(NetType *)args_local_4,*local_38);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }